

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

interval_t duckdb::ToQuartersOperator::Operation<long,duckdb::interval_t>(long input)

{
  bool bVar1;
  int iVar2;
  OutOfRangeException *this;
  allocator local_49;
  uint local_48 [4];
  string local_38;
  
  iVar2 = Cast::Operation<long,int>(input);
  bVar1 = duckdb::TryMultiplyOperator::Operation<int,int,int>(iVar2,3,(int *)local_48);
  if (bVar1) {
    return (interval_t)ZEXT416(local_48[0]);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Interval value %d quarters out of range",&local_49);
  OutOfRangeException::OutOfRangeException<long>(this,&local_38,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_QUARTER,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d quarters out of range", input);
		}
		result.days = 0;
		result.micros = 0;
		return result;
	}